

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * Fantasy_ReorderedColor_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  uint64_t uStack_40;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x52477265656e0000) {
    if ((uVar1 & 0x7fffffffff000000) != 0x52426c7565000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 8;
  }
  else if ((int)(uVar1 >> 0x20) == 0x52526564) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 1;
  }
  else {
    if ((uVar1 & 0xffffffffffff0000) != 0x52477265656e0000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_40 = 2;
  }
  *value = uStack_40;
  *value_sign = 0;
  return pcVar2;
}

Assistant:

static const char *Fantasy_ReorderedColor_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x52477265656e0000) { /* branch "RGreen" */
        if ((w & 0xffffffffff000000) == 0x52426c7565000000) { /* "RBlue" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
            if (buf != mark) {
                *value = UINT64_C(8), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "RBlue" */
            return unmatched;
        } /* "RBlue" */
    } else { /* branch "RGreen" */
        if ((w & 0xffffffff00000000) == 0x5252656400000000) { /* "RRed" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(1), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "RRed" */
            if ((w & 0xffffffffffff0000) == 0x52477265656e0000) { /* "RGreen" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "RGreen" */
                return unmatched;
            } /* "RGreen" */
        } /* "RRed" */
    } /* branch "RGreen" */
    return buf;
}